

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

SmartPointer<GEO::Environment> * __thiscall
GEO::SmartPointer<GEO::Environment>::operator=
          (SmartPointer<GEO::Environment> *this,Environment *ptr)

{
  Environment *ptr_local;
  SmartPointer<GEO::Environment> *this_local;
  
  if (ptr != this->pointer_) {
    Counted::unref(&this->pointer_->super_Counted);
    this->pointer_ = ptr;
    Counted::ref(&this->pointer_->super_Counted);
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }